

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O1

void __thiscall rpc_tests::rpc_rawparams::test_method(rpc_rawparams *this)

{
  string args;
  string args_00;
  string args_01;
  string args_02;
  string args_03;
  string args_04;
  string args_05;
  string args_06;
  string args_07;
  string args_08;
  string args_09;
  string args_10;
  string args_11;
  string args_12;
  string args_13;
  string args_14;
  string args_15;
  string args_16;
  string args_17;
  string args_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  UniValue *pUVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  string_view key;
  const_string file_24;
  string_view key_00;
  const_string file_25;
  string_view key_01;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  undefined4 in_stack_ffffffffffffebe8;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffebec;
  undefined4 uVar7;
  check_type cVar11;
  char *pcVar8;
  undefined8 in_stack_ffffffffffffebf8;
  undefined1 *puVar9;
  undefined8 in_stack_ffffffffffffec00;
  char *pcVar10;
  char *local_13b0;
  char *local_13a8;
  undefined1 *local_13a0;
  undefined1 *local_1398;
  char *local_1390;
  char *local_1388;
  undefined1 *local_1380;
  undefined1 *local_1378;
  char *local_1370;
  char *local_1368;
  char *local_1330;
  char *local_1328;
  undefined1 *local_1320;
  undefined1 *local_1318;
  char *local_1310;
  char *local_1308;
  undefined1 *local_1300;
  undefined1 *local_12f8;
  char *local_12f0;
  char *local_12e8;
  char *local_12b0;
  char *local_12a8;
  undefined1 *local_12a0;
  undefined1 *local_1298;
  char *local_1290;
  char *local_1288;
  undefined1 *local_1280;
  undefined1 *local_1278;
  char *local_1270;
  char *local_1268;
  char *local_1230;
  char *local_1228;
  undefined1 *local_1220;
  undefined1 *local_1218;
  char *local_1210;
  char *local_1208;
  undefined1 *local_1200;
  undefined1 *local_11f8;
  char *local_11f0;
  char *local_11e8;
  char *local_11b0;
  char *local_11a8;
  undefined1 *local_11a0;
  undefined1 *local_1198;
  char *local_1190;
  char *local_1188;
  undefined1 *local_1180;
  undefined1 *local_1178;
  char *local_1170;
  char *local_1168;
  char *local_1130;
  char *local_1128;
  undefined1 *local_1120;
  undefined1 *local_1118;
  char *local_1110;
  char *local_1108;
  char *local_10d0;
  char *local_10c8;
  undefined1 *local_10c0;
  undefined1 *local_10b8;
  char *local_10b0;
  char *local_10a8;
  undefined1 *local_10a0;
  undefined1 *local_1098;
  char *local_1090;
  char *local_1088;
  undefined1 *local_1080;
  undefined1 *local_1078;
  char *local_1070;
  char *local_1068;
  undefined1 *local_1060;
  undefined1 *local_1058;
  char *local_1050;
  char *local_1048;
  undefined4 local_1040;
  int local_103c;
  undefined1 *local_1038;
  undefined1 *local_1030;
  char *local_1028;
  char *local_1020;
  char *local_fe8;
  char *local_fe0;
  undefined1 *local_fd8;
  undefined1 *local_fd0;
  char *local_fc8;
  char *local_fc0;
  char *local_f88;
  char *local_f80;
  undefined1 *local_f78;
  undefined1 *local_f70;
  char *local_f68;
  char *local_f60;
  undefined1 *local_f58;
  undefined1 *local_f50;
  char *local_f48;
  char *local_f40;
  char *local_f08;
  char *local_f00;
  undefined1 *local_ef8;
  undefined1 *local_ef0;
  char *local_ee8;
  char *local_ee0;
  undefined1 *local_ed8;
  undefined1 *local_ed0;
  char *local_ec8;
  char *local_ec0;
  char *local_e88;
  char *local_e80;
  undefined1 *local_e78;
  undefined1 *local_e70;
  char *local_e68;
  char *local_e60;
  undefined1 *local_e58;
  undefined1 *local_e50;
  char *local_e48;
  char *local_e40;
  char *local_e08;
  char *local_e00;
  undefined1 *local_df8;
  undefined1 *local_df0;
  char *local_de8;
  char *local_de0;
  undefined1 *local_dd8;
  undefined1 *local_dd0;
  char *local_dc8;
  char *local_dc0;
  char *local_d88;
  char *local_d80;
  undefined1 *local_d78;
  undefined1 *local_d70;
  char *local_d68;
  char *local_d60;
  char *local_d28;
  char *local_d20;
  undefined1 *local_d18;
  undefined1 *local_d10;
  char *local_d08;
  char *local_d00;
  undefined1 *local_cf8;
  undefined1 *local_cf0;
  char *local_ce8;
  char *local_ce0;
  char *local_ca8;
  char *local_ca0;
  undefined1 *local_c98;
  undefined1 *local_c90;
  char *local_c88;
  char *local_c80;
  undefined1 *local_c78;
  undefined1 *local_c70;
  char *local_c68;
  char *local_c60;
  char *local_c28;
  char *local_c20;
  undefined1 *local_c18;
  undefined1 *local_c10;
  char *local_c08;
  char *local_c00;
  undefined1 *local_bf8;
  undefined1 *local_bf0;
  char *local_be8;
  char *local_be0;
  char *local_ba8;
  char *local_ba0;
  undefined1 *local_b98;
  undefined1 *local_b90;
  char *local_b88;
  char *local_b80;
  undefined1 *local_b78;
  undefined1 *local_b70;
  char *local_b68;
  char *local_b60;
  char *local_b28;
  char *local_b20;
  undefined1 *local_b18;
  undefined1 *local_b10;
  char *local_b08;
  char *local_b00;
  undefined1 *local_af8;
  undefined1 *local_af0;
  char *local_ae8;
  char *local_ae0;
  char *local_aa8;
  char *local_aa0;
  undefined1 *local_a98;
  undefined1 *local_a90;
  char *local_a88;
  char *local_a80;
  undefined1 *local_a78;
  undefined1 *local_a70;
  char *local_a68;
  char *local_a60;
  char *local_a28;
  char *local_a20;
  undefined1 *local_a18;
  undefined1 *local_a10;
  char *local_a08;
  char *local_a00;
  undefined1 *local_9f8;
  undefined1 *local_9f0;
  char *local_9e8;
  char *local_9e0;
  undefined4 *local_9d8;
  int *local_9d0;
  char *local_9c8;
  char *local_9c0;
  pointer local_9b8;
  element_type *peStack_9b0;
  shared_count sStack_9a8;
  size_type *local_9a0;
  size_type local_998;
  size_type local_990;
  undefined8 uStack_988;
  UniValue local_980;
  long *local_928 [2];
  long local_918 [2];
  UniValue local_908;
  long *local_8b0 [2];
  long local_8a0 [2];
  UniValue local_890;
  long *local_838 [2];
  long local_828 [2];
  UniValue local_818;
  size_type *local_7c0;
  size_type local_7b8;
  size_type local_7b0;
  undefined8 uStack_7a8;
  size_type *local_7a0;
  size_type local_798;
  size_type local_790;
  undefined8 uStack_788;
  size_type *local_780;
  size_type local_778;
  size_type local_770;
  undefined8 uStack_768;
  UniValue local_760;
  undefined1 local_708 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_6f8;
  size_type *local_6e8;
  size_type local_6e0;
  size_type local_6d8;
  undefined8 uStack_6d0;
  undefined1 local_6c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_6b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6a0;
  vector<UniValue,_std::allocator<UniValue>_> local_688;
  string rawtx;
  long *local_650 [2];
  long local_640 [2];
  UniValue local_630;
  long *local_5d8 [2];
  long local_5c8 [2];
  UniValue local_5b8;
  long *local_560 [2];
  long local_550 [2];
  UniValue local_540;
  long *local_4e8 [2];
  long local_4d8 [2];
  UniValue local_4c8;
  long *local_470 [2];
  long local_460 [2];
  UniValue local_450;
  long *local_3f8 [2];
  long local_3e8 [2];
  UniValue local_3d8;
  long *local_380 [2];
  long local_370 [2];
  UniValue local_360;
  long *local_308 [2];
  long local_2f8 [2];
  UniValue local_2e8;
  long *local_290 [2];
  long local_280 [2];
  UniValue local_270;
  long *local_218 [2];
  long local_208 [2];
  UniValue local_1f8;
  long *local_1a0 [2];
  long local_190 [2];
  UniValue local_180;
  long *local_128 [2];
  long local_118 [2];
  UniValue local_108;
  UniValue local_b0;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_48;
  long local_38;
  
  local_1030 = (undefined1 *)0x0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0.val._M_dataplus._M_p = (pointer)&local_b0.val.field_2;
  local_b0.val._M_string_length = 0;
  local_b0.val.field_2._M_local_buf[0] = '\0';
  local_b0.typ = VNULL;
  local_b0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_9e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_9e0 = "";
  local_9f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x8d;
  file.m_begin = (iterator)&local_9e8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_9f8,msg);
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"getrawtransaction","");
  args._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffebec;
  args._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffebe8;
  args._M_string_length = (size_type)_cVar11;
  args.field_2._M_allocated_capacity = in_stack_ffffffffffffebf8;
  args.field_2._8_8_ = in_stack_ffffffffffffec00;
  RPCTestingSetup::CallRPC(&local_108,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_108.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.val._M_dataplus._M_p != &local_108.val.field_2) {
    operator_delete(local_108.val._M_dataplus._M_p,local_108.val.field_2._M_allocated_capacity + 1);
  }
  if (local_128[0] != local_118) {
    operator_delete(local_128[0],local_118[0] + 1);
  }
  local_a08 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_a00 = "";
  local_a18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a10 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x8d;
  file_00.m_begin = (iterator)&local_a08;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_a18,
             msg_00);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d45f0;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_6b0._M_allocated_capacity = 0xe840f0;
  local_a28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_a20 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_6c8,1,1,WARN,_cVar11,
             (size_t)&local_a28,0x8d);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_a68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_a60 = "";
  local_a78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a70 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x8e;
  file_01.m_begin = (iterator)&local_a68;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_a78,
             msg_01);
  local_1a0[0] = local_190;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a0,"getrawtransaction not_hex","");
  args_00._M_dataplus._M_p._4_4_ = uVar7;
  args_00._M_dataplus._M_p._0_4_ = uVar6;
  args_00._M_string_length = (size_type)_cVar11;
  args_00.field_2._M_allocated_capacity = in_stack_ffffffffffffebf8;
  args_00.field_2._8_8_ = in_stack_ffffffffffffec00;
  RPCTestingSetup::CallRPC(&local_180,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_00);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_180.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_180.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.val._M_dataplus._M_p != &local_180.val.field_2) {
    operator_delete(local_180.val._M_dataplus._M_p,local_180.val.field_2._M_allocated_capacity + 1);
  }
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0],local_190[0] + 1);
  }
  local_a88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_a80 = "";
  local_a98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a90 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x8e;
  file_02.m_begin = (iterator)&local_a88;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_a98,
             msg_02);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d45f0;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_6b0._M_allocated_capacity = 0xe840f0;
  local_aa8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_aa0 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_6c8,1,1,WARN,_cVar11,
             (size_t)&local_aa8,0x8e);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_ae8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ae0 = "";
  local_af8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_af0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x8f;
  file_03.m_begin = (iterator)&local_ae8;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_af8,
             msg_03);
  local_218[0] = local_208;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_218,
             "getrawtransaction a3b807410df0b60fcb9736768df5823938b2f838694939ba45f3c0a1bff150ed not_int"
             ,"");
  args_01._M_dataplus._M_p._4_4_ = uVar7;
  args_01._M_dataplus._M_p._0_4_ = uVar6;
  args_01._M_string_length = (size_type)_cVar11;
  args_01.field_2._M_allocated_capacity = in_stack_ffffffffffffebf8;
  args_01.field_2._8_8_ = in_stack_ffffffffffffec00;
  RPCTestingSetup::CallRPC(&local_1f8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_01);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_1f8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.val._M_dataplus._M_p != &local_1f8.val.field_2) {
    operator_delete(local_1f8.val._M_dataplus._M_p,local_1f8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_218[0] != local_208) {
    operator_delete(local_218[0],local_208[0] + 1);
  }
  local_b08 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_b00 = "";
  local_b18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b10 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x8f;
  file_04.m_begin = (iterator)&local_b08;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_b18,
             msg_04);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d45f0;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_6b0._M_allocated_capacity = 0xe840f0;
  local_b28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_b20 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_6c8,1,1,WARN,_cVar11,
             (size_t)&local_b28,0x8f);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_b68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_b60 = "";
  local_b78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b70 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x91;
  file_05.m_begin = (iterator)&local_b68;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_b78,
             msg_05);
  local_290[0] = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"createrawtransaction","");
  args_02._M_dataplus._M_p._4_4_ = uVar7;
  args_02._M_dataplus._M_p._0_4_ = uVar6;
  args_02._M_string_length = (size_type)_cVar11;
  args_02.field_2._M_allocated_capacity = in_stack_ffffffffffffebf8;
  args_02.field_2._8_8_ = in_stack_ffffffffffffec00;
  RPCTestingSetup::CallRPC(&local_270,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_02);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_270.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_270.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270.val._M_dataplus._M_p != &local_270.val.field_2) {
    operator_delete(local_270.val._M_dataplus._M_p,local_270.val.field_2._M_allocated_capacity + 1);
  }
  if (local_290[0] != local_280) {
    operator_delete(local_290[0],local_280[0] + 1);
  }
  local_b88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_b80 = "";
  local_b98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b90 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x91;
  file_06.m_begin = (iterator)&local_b88;
  msg_06.m_end = pvVar5;
  msg_06.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_b98,
             msg_06);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d45f0;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_6b0._M_allocated_capacity = 0xe840f0;
  local_ba8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ba0 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_6c8,1,1,WARN,_cVar11,
             (size_t)&local_ba8,0x91);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_be8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_be0 = "";
  local_bf8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bf0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x92;
  file_07.m_begin = (iterator)&local_be8;
  msg_07.m_end = pvVar5;
  msg_07.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_bf8,
             msg_07);
  local_308[0] = local_2f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_308,"createrawtransaction null null","");
  args_03._M_dataplus._M_p._4_4_ = uVar7;
  args_03._M_dataplus._M_p._0_4_ = uVar6;
  args_03._M_string_length = (size_type)_cVar11;
  args_03.field_2._M_allocated_capacity = in_stack_ffffffffffffebf8;
  args_03.field_2._8_8_ = in_stack_ffffffffffffec00;
  RPCTestingSetup::CallRPC(&local_2e8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_03);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_2e8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2e8.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8.val._M_dataplus._M_p != &local_2e8.val.field_2) {
    operator_delete(local_2e8.val._M_dataplus._M_p,local_2e8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_308[0] != local_2f8) {
    operator_delete(local_308[0],local_2f8[0] + 1);
  }
  local_c08 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_c00 = "";
  local_c18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c10 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x92;
  file_08.m_begin = (iterator)&local_c08;
  msg_08.m_end = pvVar5;
  msg_08.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_c18,
             msg_08);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d45f0;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_6b0._M_allocated_capacity = 0xe840f0;
  local_c28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_c20 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_6c8,1,1,WARN,_cVar11,
             (size_t)&local_c28,0x92);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_c68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_c60 = "";
  local_c78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c70 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x93;
  file_09.m_begin = (iterator)&local_c68;
  msg_09.m_end = pvVar5;
  msg_09.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_c78,
             msg_09);
  local_380[0] = local_370;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_380,"createrawtransaction not_array","");
  args_04._M_dataplus._M_p._4_4_ = uVar7;
  args_04._M_dataplus._M_p._0_4_ = uVar6;
  args_04._M_string_length = (size_type)_cVar11;
  args_04.field_2._M_allocated_capacity = in_stack_ffffffffffffebf8;
  args_04.field_2._8_8_ = in_stack_ffffffffffffec00;
  RPCTestingSetup::CallRPC(&local_360,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_04);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_360.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_360.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360.val._M_dataplus._M_p != &local_360.val.field_2) {
    operator_delete(local_360.val._M_dataplus._M_p,local_360.val.field_2._M_allocated_capacity + 1);
  }
  if (local_380[0] != local_370) {
    operator_delete(local_380[0],local_370[0] + 1);
  }
  local_c88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_c80 = "";
  local_c98 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c90 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x93;
  file_10.m_begin = (iterator)&local_c88;
  msg_10.m_end = pvVar5;
  msg_10.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_c98,
             msg_10);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d45f0;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_6b0._M_allocated_capacity = 0xe840f0;
  local_ca8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ca0 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_6c8,1,1,WARN,_cVar11,
             (size_t)&local_ca8,0x93);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_ce8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ce0 = "";
  local_cf8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cf0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x94;
  file_11.m_begin = (iterator)&local_ce8;
  msg_11.m_end = pvVar5;
  msg_11.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_cf8,
             msg_11);
  local_3f8[0] = local_3e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_3f8,"createrawtransaction {} {}","");
  args_05._M_dataplus._M_p._4_4_ = uVar7;
  args_05._M_dataplus._M_p._0_4_ = uVar6;
  args_05._M_string_length = (size_type)_cVar11;
  args_05.field_2._M_allocated_capacity = in_stack_ffffffffffffebf8;
  args_05.field_2._8_8_ = in_stack_ffffffffffffec00;
  RPCTestingSetup::CallRPC(&local_3d8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_05);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_3d8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3d8.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8.val._M_dataplus._M_p != &local_3d8.val.field_2) {
    operator_delete(local_3d8.val._M_dataplus._M_p,local_3d8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_3f8[0] != local_3e8) {
    operator_delete(local_3f8[0],local_3e8[0] + 1);
  }
  local_d08 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_d00 = "";
  local_d18 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d10 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x94;
  file_12.m_begin = (iterator)&local_d08;
  msg_12.m_end = pvVar5;
  msg_12.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_d18,
             msg_12);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d45f0;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_6b0._M_allocated_capacity = 0xe840f0;
  local_d28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_d20 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_6c8,1,1,WARN,_cVar11,
             (size_t)&local_d28,0x94);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_470[0] = local_460;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_470,"createrawtransaction [] {}","");
  args_06._M_dataplus._M_p._4_4_ = uVar7;
  args_06._M_dataplus._M_p._0_4_ = uVar6;
  args_06._M_string_length = (size_type)_cVar11;
  args_06.field_2._M_allocated_capacity = in_stack_ffffffffffffebf8;
  args_06.field_2._8_8_ = in_stack_ffffffffffffec00;
  RPCTestingSetup::CallRPC(&local_450,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_06);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_450.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_450.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450.val._M_dataplus._M_p != &local_450.val.field_2) {
    operator_delete(local_450.val._M_dataplus._M_p,local_450.val.field_2._M_allocated_capacity + 1);
  }
  if (local_470[0] != local_460) {
    operator_delete(local_470[0],local_460[0] + 1);
  }
  local_d68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_d60 = "";
  local_d78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d70 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x95;
  file_13.m_begin = (iterator)&local_d68;
  msg_13.m_end = pvVar5;
  msg_13.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_d78,
             msg_13);
  local_58[0] = 1;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d6f50;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_6b0._M_allocated_capacity = 0xeeb6ee;
  local_d88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_d80 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_6c8,1,1,WARN,_cVar11,
             (size_t)&local_d88,0x95);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_dc8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_dc0 = "";
  local_dd8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_dd0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x96;
  file_14.m_begin = (iterator)&local_dc8;
  msg_14.m_end = pvVar5;
  msg_14.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_dd8,
             msg_14);
  local_4e8[0] = local_4d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4e8,"createrawtransaction [] {} extra","");
  args_07._M_dataplus._M_p._4_4_ = uVar7;
  args_07._M_dataplus._M_p._0_4_ = uVar6;
  args_07._M_string_length = (size_type)_cVar11;
  args_07.field_2._M_allocated_capacity = in_stack_ffffffffffffebf8;
  args_07.field_2._8_8_ = in_stack_ffffffffffffec00;
  RPCTestingSetup::CallRPC(&local_4c8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_07);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_4c8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4c8.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.val._M_dataplus._M_p != &local_4c8.val.field_2) {
    operator_delete(local_4c8.val._M_dataplus._M_p,local_4c8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_4e8[0] != local_4d8) {
    operator_delete(local_4e8[0],local_4d8[0] + 1);
  }
  local_de8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_de0 = "";
  local_df8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_df0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x96;
  file_15.m_begin = (iterator)&local_de8;
  msg_15.m_end = pvVar5;
  msg_15.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_df8,
             msg_15);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d45f0;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_6b0._M_allocated_capacity = 0xe840f0;
  local_e08 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_e00 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_6c8,1,1,WARN,_cVar11,
             (size_t)&local_e08,0x96);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_e48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_e40 = "";
  local_e58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e50 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x98;
  file_16.m_begin = (iterator)&local_e48;
  msg_16.m_end = pvVar5;
  msg_16.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_e58,
             msg_16);
  local_560[0] = local_550;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_560,"decoderawtransaction","");
  args_08._M_dataplus._M_p._4_4_ = uVar7;
  args_08._M_dataplus._M_p._0_4_ = uVar6;
  args_08._M_string_length = (size_type)_cVar11;
  args_08.field_2._M_allocated_capacity = in_stack_ffffffffffffebf8;
  args_08.field_2._8_8_ = in_stack_ffffffffffffec00;
  RPCTestingSetup::CallRPC(&local_540,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_08);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_540.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_540.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540.val._M_dataplus._M_p != &local_540.val.field_2) {
    operator_delete(local_540.val._M_dataplus._M_p,local_540.val.field_2._M_allocated_capacity + 1);
  }
  if (local_560[0] != local_550) {
    operator_delete(local_560[0],local_550[0] + 1);
  }
  local_e68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_e60 = "";
  local_e78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e70 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x98;
  file_17.m_begin = (iterator)&local_e68;
  msg_17.m_end = pvVar5;
  msg_17.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_e78,
             msg_17);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d45f0;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_6b0._M_allocated_capacity = 0xe840f0;
  local_e88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_e80 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_6c8,1,1,WARN,_cVar11,
             (size_t)&local_e88,0x98);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_ec8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ec0 = "";
  local_ed8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ed0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x99;
  file_18.m_begin = (iterator)&local_ec8;
  msg_18.m_end = pvVar5;
  msg_18.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_ed8,
             msg_18);
  local_5d8[0] = local_5c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_5d8,"decoderawtransaction null","");
  args_09._M_dataplus._M_p._4_4_ = uVar7;
  args_09._M_dataplus._M_p._0_4_ = uVar6;
  args_09._M_string_length = (size_type)_cVar11;
  args_09.field_2._M_allocated_capacity = in_stack_ffffffffffffebf8;
  args_09.field_2._8_8_ = in_stack_ffffffffffffec00;
  RPCTestingSetup::CallRPC(&local_5b8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_09);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_5b8.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5b8.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8.val._M_dataplus._M_p != &local_5b8.val.field_2) {
    operator_delete(local_5b8.val._M_dataplus._M_p,local_5b8.val.field_2._M_allocated_capacity + 1);
  }
  if (local_5d8[0] != local_5c8) {
    operator_delete(local_5d8[0],local_5c8[0] + 1);
  }
  local_ee8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_ee0 = "";
  local_ef8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ef0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x99;
  file_19.m_begin = (iterator)&local_ee8;
  msg_19.m_end = pvVar5;
  msg_19.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_ef8,
             msg_19);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d45f0;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_6b0._M_allocated_capacity = 0xe840f0;
  local_f08 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f00 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_6c8,1,1,WARN,_cVar11,
             (size_t)&local_f08,0x99);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_f48 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f40 = "";
  local_f58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f50 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x9a;
  file_20.m_begin = (iterator)&local_f48;
  msg_20.m_end = pvVar5;
  msg_20.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_f58,
             msg_20);
  local_650[0] = local_640;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_650,"decoderawtransaction DEADBEEF","");
  args_10._M_dataplus._M_p._4_4_ = uVar7;
  args_10._M_dataplus._M_p._0_4_ = uVar6;
  args_10._M_string_length = (size_type)_cVar11;
  args_10.field_2._M_allocated_capacity = in_stack_ffffffffffffebf8;
  args_10.field_2._8_8_ = in_stack_ffffffffffffec00;
  RPCTestingSetup::CallRPC(&local_630,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_10);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_630.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_630.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630.val._M_dataplus._M_p != &local_630.val.field_2) {
    operator_delete(local_630.val._M_dataplus._M_p,local_630.val.field_2._M_allocated_capacity + 1);
  }
  if (local_650[0] != local_640) {
    operator_delete(local_650[0],local_640[0] + 1);
  }
  local_f68 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f60 = "";
  local_f78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_f70 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x9a;
  file_21.m_begin = (iterator)&local_f68;
  msg_21.m_end = pvVar5;
  msg_21.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_f78,
             msg_21);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d45f0;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_6b0._M_allocated_capacity = 0xe840f0;
  local_f88 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_f80 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_6c8,1,1,WARN,_cVar11,
             (size_t)&local_f88,0x9a);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  rawtx._M_dataplus._M_p = (pointer)&rawtx.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&rawtx,
             "0100000001a15d57094aa7a21a28cb20b59aab8fc7d1149a3bdbcddba9c622e4f5f6a99ece010000006c493046022100f93bb0e7d8db7bd46e40132d1f8242026e045f03a0efe71bbb8e3f475e970d790221009337cd7f1f929f00cc6ff01f03729b069a7c21b59b1736ddfee5db5946c5da8c0121033b9b137ee87d5a812d6f506efdd37f0affa7ffc310711c06c7f3e097c9447c52ffffffff0100e1f505000000001976a9140389035a9225b3839e2bbf32d826a1e222031fd888ac00000000"
             ,"");
  local_58._0_8_ = &aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"decoderawtransaction ","");
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     rawtx._M_dataplus._M_p,rawtx._M_string_length);
  local_6e8 = (size_type *)(pbVar1->_M_dataplus)._M_p;
  paVar3 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e8 == paVar3) {
    local_6d8 = paVar3->_M_allocated_capacity;
    uStack_6d0 = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_6e8 = &local_6d8;
  }
  else {
    local_6d8 = paVar3->_M_allocated_capacity;
  }
  local_6e0 = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  args_11._M_dataplus._M_p._4_4_ = uVar7;
  args_11._M_dataplus._M_p._0_4_ = uVar6;
  args_11._M_string_length = (size_type)_cVar11;
  args_11.field_2._M_allocated_capacity = in_stack_ffffffffffffebf8;
  args_11.field_2._8_8_ = in_stack_ffffffffffffec00;
  RPCTestingSetup::CallRPC((UniValue *)local_6c8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_11);
  local_b0.typ = local_6c8._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_b0.val,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_6c8 + 8));
  local_6f8._M_allocated_capacity =
       (size_type)
       local_b0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_708._8_8_ =
       local_b0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_708._0_8_ =
       local_b0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_b0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_6a0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_b0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_6a0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_b0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_6a0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_6a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_708);
  local_6f8._M_allocated_capacity =
       (size_type)
       local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_708._8_8_ =
       local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_708._0_8_ =
       local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_688.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_688.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_688.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_688.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_688.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_688.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)local_708);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_688);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._8_8_ != &aStack_6b0) {
    operator_delete((void *)local_6c8._8_8_,(ulong)(aStack_6b0._M_allocated_capacity + 1));
  }
  if (local_6e8 != &local_6d8) {
    operator_delete(local_6e8,local_6d8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &aStack_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
  }
  local_fc8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_fc0 = "";
  local_fd8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_fd0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x9c;
  file_22.m_begin = (iterator)&local_fc8;
  msg_22.m_end = pvVar5;
  msg_22.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_fd8,
             msg_22);
  local_58[0] = (readonly_property<bool>)0x1;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d6fd0;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_6b0._M_allocated_capacity = 0xeeb978;
  local_fe8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_fe0 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_6c8,1,1,WARN,_cVar11,
             (size_t)&local_fe8,0x9c);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_1028 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1020 = "";
  local_1038 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1030 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x9d;
  file_23.m_begin = (iterator)&local_1028;
  msg_23.m_end = pvVar5;
  msg_23.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_1038,
             msg_23);
  local_708._8_8_ = local_708._8_8_ & 0xffffffffffffff00;
  local_708._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_6f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_6f8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  pUVar2 = ::UniValue::get_obj(&local_b0);
  key._M_str = "size";
  key._M_len = 4;
  pUVar2 = ::UniValue::find_value(pUVar2,key);
  local_103c = ::UniValue::getInt<int>(pUVar2);
  local_9d0 = &local_103c;
  local_9d8 = &local_1040;
  local_1040 = 0xc1;
  peStack_9b0 = (element_type *)0x0;
  sStack_9a8.pi_ = (sp_counted_base *)0x0;
  local_9c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_9c0 = "";
  puVar9 = local_6c8;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d3e70;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3e70;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  aStack_6b0._M_allocated_capacity = (size_type)&local_9d0;
  aStack_48._8_8_ = &local_9d8;
  local_9b8._0_1_ = (class_property<bool>)(class_property<bool>)(local_103c == 0xc1);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_9b8,(lazy_ostream *)local_708,1,2,REQUIRE,0xeeba1f,
             (size_t)&local_9c8,0x9d,puVar9,"193",local_58);
  boost::detail::shared_count::~shared_count(&sStack_9a8);
  local_1050 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1048 = "";
  local_1060 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1058 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x9e;
  file_24.m_begin = (iterator)&local_1050;
  msg_24.m_end = pvVar5;
  msg_24.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_1060,
             msg_24);
  local_708._8_8_ = local_708._8_8_ & 0xffffffffffffff00;
  local_708._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_6f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_6f8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  pUVar2 = ::UniValue::get_obj(&local_b0);
  key_00._M_str = "version";
  key_00._M_len = 7;
  pUVar2 = ::UniValue::find_value(pUVar2,key_00);
  local_103c = ::UniValue::getInt<int>(pUVar2);
  local_1040 = 1;
  local_9b8._0_1_ = (class_property<bool>)(local_103c == 1);
  peStack_9b0 = (element_type *)0x0;
  sStack_9a8.pi_ = (sp_counted_base *)0x0;
  local_9c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_9c0 = "";
  local_9d0 = &local_103c;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d3e70;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_9d8 = &local_1040;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3e70;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  aStack_6b0._M_allocated_capacity = (size_type)&local_9d0;
  aStack_48._8_8_ = &local_9d8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_9b8,(lazy_ostream *)local_708,1,2,REQUIRE,0xeeba50,
             (size_t)&local_9c8,0x9e,puVar9,"1",local_58);
  boost::detail::shared_count::~shared_count(&sStack_9a8);
  local_1070 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1068 = "";
  local_1080 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1078 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x9f;
  file_25.m_begin = (iterator)&local_1070;
  msg_25.m_end = pvVar5;
  msg_25.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_1080,
             msg_25);
  local_708._8_8_ = local_708._8_8_ & 0xffffffffffffff00;
  local_708._0_8_ = &PTR__lazy_ostream_013d3cb0;
  local_6f8._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_6f8._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  pUVar2 = ::UniValue::get_obj(&local_b0);
  key_01._M_str = "locktime";
  key_01._M_len = 8;
  pUVar2 = ::UniValue::find_value(pUVar2,key_01);
  local_103c = ::UniValue::getInt<int>(pUVar2);
  local_1040 = 0;
  local_9b8 = (pointer)CONCAT71(local_9b8._1_7_,local_103c == 0);
  peStack_9b0 = (element_type *)0x0;
  sStack_9a8.pi_ = (sp_counted_base *)0x0;
  local_9c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_9c0 = "";
  local_9d0 = &local_103c;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d3e70;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_9d8 = &local_1040;
  local_58._8_8_ = local_58._8_8_ & 0xffffffffffffff00;
  local_58._0_8_ = &PTR__lazy_ostream_013d3e70;
  aStack_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pcVar10 = "0";
  pcVar8 = "r.get_obj().find_value(\"locktime\").getInt<int>()";
  uVar6 = 2;
  uVar7 = 0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  aStack_6b0._M_allocated_capacity = (size_type)&local_9d0;
  aStack_48._8_8_ = &local_9d8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_9b8,(lazy_ostream *)local_708,1,2,REQUIRE,0xeeba80,
             (size_t)&local_9c8,0x9f,puVar9,"0",local_58);
  boost::detail::shared_count::~shared_count(&sStack_9a8);
  local_1090 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1088 = "";
  local_10a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1098 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0xa0;
  file_26.m_begin = (iterator)&local_1090;
  msg_26.m_end = pvVar5;
  msg_26.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_10a0,
             msg_26);
  local_58._0_8_ = &aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"decoderawtransaction ","");
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     rawtx._M_dataplus._M_p,rawtx._M_string_length);
  local_6c8._0_8_ = (pbVar1->_M_dataplus)._M_p;
  paVar3 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._0_8_ == paVar3) {
    local_6c8._16_8_ = paVar3->_M_allocated_capacity;
    aStack_6b0._M_allocated_capacity = *(long *)((long)&pbVar1->field_2 + 8);
    local_6c8._0_8_ = local_6c8 + 0x10;
  }
  else {
    local_6c8._16_8_ = paVar3->_M_allocated_capacity;
  }
  local_6c8._8_8_ = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8
                      ," extra");
  local_780 = (size_type *)(pbVar1->_M_dataplus)._M_p;
  paVar3 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_780 == paVar3) {
    local_770 = paVar3->_M_allocated_capacity;
    uStack_768 = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_780 = &local_770;
  }
  else {
    local_770 = paVar3->_M_allocated_capacity;
  }
  local_778 = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  args_12._M_dataplus._M_p._4_4_ = uVar7;
  args_12._M_dataplus._M_p._0_4_ = uVar6;
  args_12._M_string_length = (size_type)pcVar8;
  args_12.field_2._M_allocated_capacity = (size_type)puVar9;
  args_12.field_2._8_8_ = pcVar10;
  RPCTestingSetup::CallRPC(&local_760,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_12);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_760.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_760.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760.val._M_dataplus._M_p != &local_760.val.field_2) {
    operator_delete(local_760.val._M_dataplus._M_p,local_760.val.field_2._M_allocated_capacity + 1);
  }
  if (local_780 != &local_770) {
    operator_delete(local_780,local_770 + 1);
  }
  if ((undefined1 *)local_6c8._0_8_ != local_6c8 + 0x10) {
    operator_delete((void *)local_6c8._0_8_,local_6c8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &aStack_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
  }
  local_10b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_10a8 = "";
  local_10c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_10b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0xa0;
  file_27.m_begin = (iterator)&local_10b0;
  msg_27.m_end = pvVar5;
  msg_27.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_10c0,
             msg_27);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d45f0;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_6b0._M_allocated_capacity = 0xe840f0;
  local_10d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_10c8 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_6c8,1,1,WARN,(check_type)pcVar8,
             (size_t)&local_10d0,0xa0);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_708._0_8_ = &local_6f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_708,"decoderawtransaction ","");
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_708,
                     rawtx._M_dataplus._M_p,rawtx._M_string_length);
  local_58._0_8_ = (pbVar1->_M_dataplus)._M_p;
  paVar3 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ == paVar3) {
    aStack_48._M_allocated_capacity = paVar3->_M_allocated_capacity;
    aStack_48._8_8_ = *(long *)((long)&pbVar1->field_2 + 8);
    local_58._0_8_ = &aStack_48;
  }
  else {
    aStack_48._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_58._8_8_ = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                      " false");
  local_7a0 = (size_type *)(pbVar1->_M_dataplus)._M_p;
  paVar3 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a0 == paVar3) {
    local_790 = paVar3->_M_allocated_capacity;
    uStack_788 = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_7a0 = &local_790;
  }
  else {
    local_790 = paVar3->_M_allocated_capacity;
  }
  local_798 = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  args_13._M_dataplus._M_p._4_4_ = uVar7;
  args_13._M_dataplus._M_p._0_4_ = uVar6;
  args_13._M_string_length = (size_type)pcVar8;
  args_13.field_2._M_allocated_capacity = (size_type)puVar9;
  args_13.field_2._8_8_ = pcVar10;
  RPCTestingSetup::CallRPC((UniValue *)local_6c8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_13);
  local_b0.typ = local_6c8._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_b0.val,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_6c8 + 8));
  sStack_9a8.pi_ =
       (sp_counted_base *)
       local_b0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  peStack_9b0 = (element_type *)
                local_b0.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_9b8 = (pointer)local_b0.keys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  local_b0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_6a0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_b0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_6a0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_b0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_6a0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_6a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_9b8);
  sStack_9a8.pi_ =
       (sp_counted_base *)
       local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  peStack_9b0 = (element_type *)
                local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_9b8 = local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_688.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_688.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_688.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_688.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_688.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_688.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_9b8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_688);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._8_8_ != &aStack_6b0) {
    operator_delete((void *)local_6c8._8_8_,(ulong)(aStack_6b0._M_allocated_capacity + 1));
  }
  if (local_7a0 != &local_790) {
    operator_delete(local_7a0,local_790 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &aStack_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708._0_8_ != &local_6f8) {
    operator_delete((void *)local_708._0_8_,(ulong)(local_6f8._M_allocated_capacity + 1));
  }
  local_1110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1108 = "";
  local_1120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1118 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0xa1;
  file_28.m_begin = (iterator)&local_1110;
  msg_28.m_end = pvVar5;
  msg_28.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_1120,
             msg_28);
  local_58[0] = (readonly_property<bool>)0x1;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d7050;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_6b0._M_allocated_capacity = 0xeebab1;
  local_1130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1128 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_6c8,1,1,WARN,(check_type)pcVar8,
             (size_t)&local_1130,0xa1);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_1170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1168 = "";
  local_1180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1178 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0xa2;
  file_29.m_begin = (iterator)&local_1170;
  msg_29.m_end = pvVar5;
  msg_29.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_1180,
             msg_29);
  local_708._0_8_ = &local_6f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_708,"decoderawtransaction ","");
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_708,
                     rawtx._M_dataplus._M_p,rawtx._M_string_length);
  local_58._0_8_ = (pbVar1->_M_dataplus)._M_p;
  paVar3 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ == paVar3) {
    aStack_48._M_allocated_capacity = paVar3->_M_allocated_capacity;
    aStack_48._8_8_ = *(long *)((long)&pbVar1->field_2 + 8);
    local_58._0_8_ = &aStack_48;
  }
  else {
    aStack_48._M_allocated_capacity = paVar3->_M_allocated_capacity;
  }
  local_58._8_8_ = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                      " false extra");
  local_7c0 = (size_type *)(pbVar1->_M_dataplus)._M_p;
  paVar3 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c0 == paVar3) {
    local_7b0 = paVar3->_M_allocated_capacity;
    uStack_7a8 = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_7c0 = &local_7b0;
  }
  else {
    local_7b0 = paVar3->_M_allocated_capacity;
  }
  local_7b8 = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  args_14._M_dataplus._M_p._4_4_ = uVar7;
  args_14._M_dataplus._M_p._0_4_ = uVar6;
  args_14._M_string_length = (size_type)pcVar8;
  args_14.field_2._M_allocated_capacity = (size_type)puVar9;
  args_14.field_2._8_8_ = pcVar10;
  RPCTestingSetup::CallRPC((UniValue *)local_6c8,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_14);
  local_b0.typ = local_6c8._0_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&local_b0.val,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_6c8 + 8));
  sStack_9a8.pi_ =
       (sp_counted_base *)
       local_b0.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  peStack_9b0 = (element_type *)
                local_b0.keys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  local_9b8 = (pointer)local_b0.keys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
  local_b0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_6a0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_b0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_6a0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_b0.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_6a0.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_6a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_6a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6a0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_9b8);
  sStack_9a8.pi_ =
       (sp_counted_base *)
       local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  peStack_9b0 = (element_type *)
                local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_9b8 = local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_688.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_688.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_b0.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_688.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_688.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_688.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_688.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&local_9b8);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_688);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_6a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._8_8_ != &aStack_6b0) {
    operator_delete((void *)local_6c8._8_8_,(ulong)(aStack_6b0._M_allocated_capacity + 1));
  }
  if (local_7c0 != &local_7b0) {
    operator_delete(local_7c0,local_7b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &aStack_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708._0_8_ != &local_6f8) {
    operator_delete((void *)local_708._0_8_,(ulong)(local_6f8._M_allocated_capacity + 1));
  }
  local_1190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1188 = "";
  local_11a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1198 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0xa2;
  file_30.m_begin = (iterator)&local_1190;
  msg_30.m_end = pvVar5;
  msg_30.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_11a0,
             msg_30);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d45f0;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_6b0._M_allocated_capacity = 0xe840f0;
  local_11b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_11a8 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_6c8,1,1,WARN,(check_type)pcVar8,
             (size_t)&local_11b0,0xa2);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_11f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_11e8 = "";
  local_1200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_11f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0xa5;
  file_31.m_begin = (iterator)&local_11f0;
  msg_31.m_end = pvVar5;
  msg_31.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_1200,
             msg_31);
  local_838[0] = local_828;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_838,"sendrawtransaction","");
  args_15._M_dataplus._M_p._4_4_ = uVar7;
  args_15._M_dataplus._M_p._0_4_ = uVar6;
  args_15._M_string_length = (size_type)pcVar8;
  args_15.field_2._M_allocated_capacity = (size_type)puVar9;
  args_15.field_2._8_8_ = pcVar10;
  RPCTestingSetup::CallRPC(&local_818,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_15);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_818.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_818.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.val._M_dataplus._M_p != &local_818.val.field_2) {
    operator_delete(local_818.val._M_dataplus._M_p,local_818.val.field_2._M_allocated_capacity + 1);
  }
  if (local_838[0] != local_828) {
    operator_delete(local_838[0],local_828[0] + 1);
  }
  local_1210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1208 = "";
  local_1220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0xa5;
  file_32.m_begin = (iterator)&local_1210;
  msg_32.m_end = pvVar5;
  msg_32.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_1220,
             msg_32);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d45f0;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_6b0._M_allocated_capacity = 0xe840f0;
  local_1230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1228 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_6c8,1,1,WARN,(check_type)pcVar8,
             (size_t)&local_1230,0xa5);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_1270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1268 = "";
  local_1280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0xa6;
  file_33.m_begin = (iterator)&local_1270;
  msg_33.m_end = pvVar5;
  msg_33.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_1280,
             msg_33);
  local_8b0[0] = local_8a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_8b0,"sendrawtransaction null","");
  args_16._M_dataplus._M_p._4_4_ = uVar7;
  args_16._M_dataplus._M_p._0_4_ = uVar6;
  args_16._M_string_length = (size_type)pcVar8;
  args_16.field_2._M_allocated_capacity = (size_type)puVar9;
  args_16.field_2._8_8_ = pcVar10;
  RPCTestingSetup::CallRPC(&local_890,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_16);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_890.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_890.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890.val._M_dataplus._M_p != &local_890.val.field_2) {
    operator_delete(local_890.val._M_dataplus._M_p,local_890.val.field_2._M_allocated_capacity + 1);
  }
  if (local_8b0[0] != local_8a0) {
    operator_delete(local_8b0[0],local_8a0[0] + 1);
  }
  local_1290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1288 = "";
  local_12a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0xa6;
  file_34.m_begin = (iterator)&local_1290;
  msg_34.m_end = pvVar5;
  msg_34.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_12a0,
             msg_34);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d45f0;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_6b0._M_allocated_capacity = 0xe840f0;
  local_12b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_12a8 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_6c8,1,1,WARN,(check_type)pcVar8,
             (size_t)&local_12b0,0xa6);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_12f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_12e8 = "";
  local_1300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_12f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0xa7;
  file_35.m_begin = (iterator)&local_12f0;
  msg_35.m_end = pvVar5;
  msg_35.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_1300,
             msg_35);
  local_928[0] = local_918;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_928,"sendrawtransaction DEADBEEF","");
  args_17._M_dataplus._M_p._4_4_ = uVar7;
  args_17._M_dataplus._M_p._0_4_ = uVar6;
  args_17._M_string_length = (size_type)pcVar8;
  args_17.field_2._M_allocated_capacity = (size_type)puVar9;
  args_17.field_2._8_8_ = pcVar10;
  RPCTestingSetup::CallRPC(&local_908,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_17);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_908.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_908.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908.val._M_dataplus._M_p != &local_908.val.field_2) {
    operator_delete(local_908.val._M_dataplus._M_p,local_908.val.field_2._M_allocated_capacity + 1);
  }
  if (local_928[0] != local_918) {
    operator_delete(local_928[0],local_918[0] + 1);
  }
  local_1310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1308 = "";
  local_1320 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1318 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0xa7;
  file_36.m_begin = (iterator)&local_1310;
  msg_36.m_end = pvVar5;
  msg_36.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_1320,
             msg_36);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d45f0;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_6b0._M_allocated_capacity = 0xe840f0;
  local_1330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1328 = "";
  uVar6 = 0;
  uVar7 = 0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_6c8,1,1,WARN,(check_type)pcVar8,
             (size_t)&local_1330,0xa7);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  local_1370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1368 = "";
  local_1380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1378 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0xa8;
  file_37.m_begin = (iterator)&local_1370;
  msg_37.m_end = pvVar5;
  msg_37.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_1380,
             msg_37);
  local_58._0_8_ = &aStack_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"sendrawtransaction ","");
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                     rawtx._M_dataplus._M_p,rawtx._M_string_length);
  local_6c8._0_8_ = (pbVar1->_M_dataplus)._M_p;
  paVar3 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6c8._0_8_ == paVar3) {
    local_6c8._16_8_ = paVar3->_M_allocated_capacity;
    aStack_6b0._M_allocated_capacity = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_6c8._0_8_ = local_6c8 + 0x10;
  }
  else {
    local_6c8._16_8_ = paVar3->_M_allocated_capacity;
  }
  local_6c8._8_8_ = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  pbVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c8
                      ," extra");
  local_9a0 = (size_type *)(pbVar1->_M_dataplus)._M_p;
  paVar3 = &pbVar1->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9a0 == paVar3) {
    local_990 = paVar3->_M_allocated_capacity;
    uStack_988 = *(undefined8 *)((long)&pbVar1->field_2 + 8);
    local_9a0 = &local_990;
  }
  else {
    local_990 = paVar3->_M_allocated_capacity;
  }
  local_998 = pbVar1->_M_string_length;
  (pbVar1->_M_dataplus)._M_p = (pointer)paVar3;
  pbVar1->_M_string_length = 0;
  (pbVar1->field_2)._M_local_buf[0] = '\0';
  args_18._M_dataplus._M_p._4_4_ = uVar7;
  args_18._M_dataplus._M_p._0_4_ = uVar6;
  args_18._M_string_length = (size_type)pcVar8;
  args_18.field_2._M_allocated_capacity = (size_type)puVar9;
  args_18.field_2._8_8_ = pcVar10;
  RPCTestingSetup::CallRPC(&local_980,&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,args_18);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_980.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_980.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_980.val._M_dataplus._M_p != &local_980.val.field_2) {
    operator_delete(local_980.val._M_dataplus._M_p,local_980.val.field_2._M_allocated_capacity + 1);
  }
  if (local_9a0 != &local_990) {
    operator_delete(local_9a0,local_990 + 1);
  }
  if ((undefined1 *)local_6c8._0_8_ != local_6c8 + 0x10) {
    operator_delete((void *)local_6c8._0_8_,local_6c8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &aStack_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(aStack_48._M_allocated_capacity + 1));
  }
  local_1390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_1388 = "";
  local_13a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1398 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0xa8;
  file_38.m_begin = (iterator)&local_1390;
  msg_38.m_end = pvVar5;
  msg_38.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_13a0,
             msg_38);
  local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
  local_58._8_8_ = (element_type *)0x0;
  aStack_48._M_allocated_capacity = 0;
  local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffffffffff00;
  local_6c8._0_8_ = &PTR__lazy_ostream_013d45f0;
  local_6c8._16_8_ = boost::unit_test::lazy_ostream::inst;
  aStack_6b0._M_allocated_capacity = 0xe840f0;
  local_13b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/rpc_tests.cpp";
  local_13a8 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_58,(lazy_ostream *)local_6c8,1,1,WARN,(check_type)pcVar8,
             (size_t)&local_13b0,0xa8);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_48._M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)rawtx._M_dataplus._M_p != &rawtx.field_2) {
    operator_delete(rawtx._M_dataplus._M_p,rawtx.field_2._M_allocated_capacity + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_b0.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.val._M_dataplus._M_p != &local_b0.val.field_2) {
    operator_delete(local_b0.val._M_dataplus._M_p,
                    CONCAT71(local_b0.val.field_2._M_allocated_capacity._1_7_,
                             local_b0.val.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(rpc_rawparams)
{
    // Test raw transaction API argument handling
    UniValue r;

    BOOST_CHECK_THROW(CallRPC("getrawtransaction"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC("getrawtransaction not_hex"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC("getrawtransaction a3b807410df0b60fcb9736768df5823938b2f838694939ba45f3c0a1bff150ed not_int"), std::runtime_error);

    BOOST_CHECK_THROW(CallRPC("createrawtransaction"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC("createrawtransaction null null"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC("createrawtransaction not_array"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC("createrawtransaction {} {}"), std::runtime_error);
    BOOST_CHECK_NO_THROW(CallRPC("createrawtransaction [] {}"));
    BOOST_CHECK_THROW(CallRPC("createrawtransaction [] {} extra"), std::runtime_error);

    BOOST_CHECK_THROW(CallRPC("decoderawtransaction"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC("decoderawtransaction null"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC("decoderawtransaction DEADBEEF"), std::runtime_error);
    std::string rawtx = "0100000001a15d57094aa7a21a28cb20b59aab8fc7d1149a3bdbcddba9c622e4f5f6a99ece010000006c493046022100f93bb0e7d8db7bd46e40132d1f8242026e045f03a0efe71bbb8e3f475e970d790221009337cd7f1f929f00cc6ff01f03729b069a7c21b59b1736ddfee5db5946c5da8c0121033b9b137ee87d5a812d6f506efdd37f0affa7ffc310711c06c7f3e097c9447c52ffffffff0100e1f505000000001976a9140389035a9225b3839e2bbf32d826a1e222031fd888ac00000000";
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("decoderawtransaction ")+rawtx));
    BOOST_CHECK_EQUAL(r.get_obj().find_value("size").getInt<int>(), 193);
    BOOST_CHECK_EQUAL(r.get_obj().find_value("version").getInt<int>(), 1);
    BOOST_CHECK_EQUAL(r.get_obj().find_value("locktime").getInt<int>(), 0);
    BOOST_CHECK_THROW(CallRPC(std::string("decoderawtransaction ")+rawtx+" extra"), std::runtime_error);
    BOOST_CHECK_NO_THROW(r = CallRPC(std::string("decoderawtransaction ")+rawtx+" false"));
    BOOST_CHECK_THROW(r = CallRPC(std::string("decoderawtransaction ")+rawtx+" false extra"), std::runtime_error);

    // Only check failure cases for sendrawtransaction, there's no network to send to...
    BOOST_CHECK_THROW(CallRPC("sendrawtransaction"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC("sendrawtransaction null"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC("sendrawtransaction DEADBEEF"), std::runtime_error);
    BOOST_CHECK_THROW(CallRPC(std::string("sendrawtransaction ")+rawtx+" extra"), std::runtime_error);
}